

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

void __thiscall DatUnpacker::Exception::Exception(Exception *this,string *message)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_0010e8f0;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,pcVar1,pcVar1 + message->_M_string_length);
  return;
}

Assistant:

Exception::Exception(const std::string& message) : _message(message)
    {
    }